

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::EndTable(void)

{
  ImVec2 *pIVar1;
  ImVec4 *pIVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImGuiWindow *window;
  ImGuiWindow *pIVar7;
  ulong uVar8;
  ImGuiTableColumn *pIVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  ImGuiTable *pIVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  ImVec2 local_38;
  
  pIVar10 = GImGui;
  pIVar14 = GImGui->CurrentTable;
  if (pIVar14->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar14);
  }
  uVar18 = pIVar14->Flags;
  window = pIVar14->InnerWindow;
  pIVar7 = pIVar14->OuterWindow;
  if (pIVar14->IsInsideRow == true) {
    TableEndRow(pIVar14);
  }
  if (((uVar18 & 0x20) != 0) && (pIVar14->HoveredColumnBody != -1)) {
    bVar11 = IsAnyItemHovered();
    if (!bVar11) {
      bVar11 = IsMouseReleased(1);
      if (bVar11) {
        TableOpenContextMenu((int)pIVar14->HoveredColumnBody);
      }
    }
  }
  (window->DC).PrevLineSize = pIVar14->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar14->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar14->HostBackupCursorMaxPos;
  fVar3 = pIVar14->RowPosY2;
  if (window == pIVar7) {
    if ((uVar18 >> 0x11 & 1) == 0) {
      fVar22 = (pIVar14->OuterRect).Max.y;
      uVar17 = -(uint)(fVar3 <= fVar22);
      fVar22 = (float)(~uVar17 & (uint)fVar3 | (uint)fVar22 & uVar17);
      (pIVar14->InnerRect).Max.y = fVar22;
      (pIVar14->OuterRect).Max.y = fVar22;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar3;
  }
  fVar22 = (pIVar14->WorkRect).Max.y;
  fVar21 = (pIVar14->OuterRect).Max.y;
  uVar17 = -(uint)(fVar21 <= fVar22);
  (pIVar14->WorkRect).Max.y = (float)(~uVar17 & (uint)fVar21 | (uint)fVar22 & uVar17);
  pIVar14->LastOuterHeight = fVar21 - (pIVar14->OuterRect).Min.y;
  if (((uint)pIVar14->Flags >> 0x18 & 1) != 0) {
    fVar22 = (pIVar14->InnerWindow->DC).CursorMaxPos.x;
    if ((long)pIVar14->RightMostEnabledColumn != -1) {
      fVar21 = 0.0;
      if (((uint)pIVar14->Flags >> 10 & 1) != 0) {
        fVar21 = 1.0;
      }
      fVar21 = ((pIVar14->Columns).Data[pIVar14->RightMostEnabledColumn].WorkMaxX +
                pIVar14->CellPaddingX + pIVar14->OuterPaddingX) - fVar21;
      uVar17 = -(uint)(fVar21 <= fVar22);
      fVar22 = (float)(uVar17 & (uint)fVar22 | ~uVar17 & (uint)fVar21);
    }
    if (pIVar14->ResizedColumn != -1) {
      uVar17 = -(uint)(pIVar14->ResizeLockMinContentsX2 <= fVar22);
      fVar22 = (float)((uint)fVar22 & uVar17 | ~uVar17 & (uint)pIVar14->ResizeLockMinContentsX2);
    }
    (pIVar14->InnerWindow->DC).CursorMaxPos.x = fVar22;
  }
  if ((uVar18 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  pIVar2 = (window->DrawList->_ClipRectStack).Data +
           (long)(window->DrawList->_ClipRectStack).Size + -1;
  fVar22 = pIVar2->y;
  fVar21 = pIVar2->z;
  fVar20 = pIVar2->w;
  (window->ClipRect).Min.x = pIVar2->x;
  (window->ClipRect).Min.y = fVar22;
  (window->ClipRect).Max.x = fVar21;
  (window->ClipRect).Max.y = fVar20;
  if ((uVar18 & 0x780) != 0) {
    TableDrawBorders(pIVar14);
  }
  ImDrawListSplitter::SetCurrentChannel(&pIVar14->DrawSplitter,window->DrawList,0);
  if ((pIVar14->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar14);
  }
  ImDrawListSplitter::Merge(&pIVar14->DrawSplitter,window->DrawList);
  fVar22 = pIVar14->CellPaddingX + pIVar14->CellPaddingX;
  pIVar14->ColumnsAutoFitWidth =
       (float)(int)pIVar14->ColumnsEnabledCount * fVar22 +
       pIVar14->OuterPaddingX + pIVar14->OuterPaddingX +
       (float)(pIVar14->ColumnsEnabledCount + -1) *
       (pIVar14->CellSpacingX1 + pIVar14->CellSpacingX2);
  iVar13 = pIVar14->ColumnsCount;
  if (0 < (long)iVar13) {
    uVar8 = pIVar14->EnabledMaskByIndex;
    lVar15 = 0x10;
    uVar16 = 0;
    do {
      if ((uVar8 >> (uVar16 & 0x3f) & 1) != 0) {
        pIVar9 = (pIVar14->Columns).Data;
        if ((*(uint *)((long)pIVar9 + lVar15 + -0x10) & 0x18) == 8) {
          fVar21 = *(float *)((long)&pIVar9->Flags + lVar15);
        }
        else {
          fVar21 = TableGetColumnWidthAuto
                             (pIVar14,(ImGuiTableColumn *)((long)pIVar9 + lVar15 + -0x10));
        }
        pIVar14->ColumnsAutoFitWidth = fVar21 + pIVar14->ColumnsAutoFitWidth;
      }
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x68;
    } while ((long)iVar13 != uVar16);
  }
  if ((window == pIVar7) || ((pIVar14->Flags & 0x1000000U) != 0)) {
    if (((long)pIVar14->LastResizedColumn != -1) &&
       (((pIVar14->ResizedColumn == -1 && (window->ScrollbarX == true)) &&
        (pIVar14->InstanceInteracted == pIVar14->InstanceCurrent)))) {
      fVar22 = fVar22 + pIVar14->MinColumnWidth;
      fVar21 = (pIVar14->Columns).Data[pIVar14->LastResizedColumn].MaxX;
      if ((pIVar14->InnerClipRect).Min.x <= fVar21) {
        pIVar1 = &(pIVar14->InnerClipRect).Max;
        if (fVar21 < pIVar1->x || fVar21 == pIVar1->x) goto LAB_0021bb4f;
        fVar22 = fVar22 + (fVar21 - (window->Pos).x);
      }
      else {
        fVar22 = (fVar21 - (window->Pos).x) - fVar22;
      }
      SetScrollFromPosX(window,fVar22,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_0021bb4f:
  if (((long)pIVar14->ResizedColumn != -1) &&
     (pIVar14->InstanceCurrent == pIVar14->InstanceInteracted)) {
    pIVar14->ResizedColumnNextWidth =
         (float)(int)((((((pIVar10->IO).MousePos.x - (pIVar10->ActiveIdClickOffset).x) + 4.0) -
                       (pIVar14->Columns).Data[pIVar14->ResizedColumn].MinX) -
                      pIVar14->CellSpacingX1) - (pIVar14->CellPaddingX + pIVar14->CellPaddingX));
  }
  PopID();
  fVar22 = (pIVar7->DC).CursorMaxPos.x;
  fVar21 = (pIVar7->DC).CursorMaxPos.y;
  IVar5 = (pIVar14->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar14->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar5;
  IVar5 = (pIVar14->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar14->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar5;
  window->SkipItems = pIVar14->HostSkipItems;
  (pIVar7->DC).CursorPos = (pIVar14->OuterRect).Min;
  (pIVar7->DC).ItemWidth = pIVar14->HostBackupItemWidth;
  (pIVar7->DC).ItemWidthStack.Size = pIVar14->HostBackupItemWidthStackSize;
  (pIVar7->DC).ColumnsOffset.x = (pIVar14->HostBackupColumnsOffset).x;
  if (window == pIVar7) {
    IVar5 = (pIVar14->OuterRect).Min;
    IVar6 = (pIVar14->OuterRect).Max;
    local_38.x = IVar6.x - IVar5.x;
    local_38.y = IVar6.y - IVar5.y;
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar14->OuterRect,0,(ImRect *)0x0);
  }
  else {
    EndChild();
  }
  uVar18 = pIVar14->Flags;
  if ((uVar18 >> 0x10 & 1) == 0) {
    fVar20 = (pIVar14->UserOuterSize).x;
    fVar19 = 0.0;
    if (fVar20 <= 0.0) {
      if ((uVar18 >> 0x18 & 1) != 0) {
        fVar19 = (window->ScrollbarSizes).x;
      }
      fVar23 = (pIVar14->OuterRect).Min.x + pIVar14->ColumnsAutoFitWidth;
      fVar4 = (pIVar7->DC).IdealMaxPos.x;
      fVar20 = (fVar19 + fVar23) - fVar20;
      uVar17 = -(uint)(fVar20 <= fVar4);
      (pIVar7->DC).IdealMaxPos.x = (float)(uVar17 & (uint)fVar4 | ~uVar17 & (uint)fVar20);
      fVar20 = (pIVar14->OuterRect).Max.x;
      if (fVar23 <= fVar20) {
        fVar20 = fVar23;
      }
    }
    else {
      fVar20 = (pIVar14->OuterRect).Max.x;
    }
  }
  else {
    fVar20 = (pIVar14->OuterRect).Min.x + pIVar14->ColumnsAutoFitWidth;
  }
  uVar17 = -(uint)(fVar20 <= fVar22);
  (pIVar7->DC).CursorMaxPos.x = (float)(~uVar17 & (uint)fVar20 | (uint)fVar22 & uVar17);
  fVar22 = (pIVar14->UserOuterSize).y;
  fVar20 = 0.0;
  if (fVar22 <= 0.0) {
    if ((uVar18 >> 0x19 & 1) != 0) {
      fVar20 = (window->ScrollbarSizes).y;
    }
    fVar19 = (pIVar7->DC).IdealMaxPos.y;
    fVar22 = (fVar20 + fVar3) - fVar22;
    uVar18 = -(uint)(fVar22 <= fVar19);
    (pIVar7->DC).IdealMaxPos.y = (float)(uVar18 & (uint)fVar19 | ~uVar18 & (uint)fVar22);
    fVar22 = (pIVar14->OuterRect).Max.y;
    if (fVar3 <= fVar22) {
      fVar22 = fVar3;
    }
  }
  else {
    fVar22 = (pIVar14->OuterRect).Max.y;
  }
  uVar18 = -(uint)(fVar22 <= fVar21);
  (pIVar7->DC).CursorMaxPos.y = (float)(~uVar18 & (uint)fVar22 | (uint)fVar21 & uVar18);
  if (pIVar14->IsSettingsDirty == true) {
    TableSaveSettings(pIVar14);
  }
  pIVar14->IsInitializing = false;
  iVar13 = (pIVar10->CurrentTableStack).Size;
  iVar12 = iVar13 + -1;
  (pIVar10->CurrentTableStack).Size = iVar12;
  if (iVar12 == 0) {
    pIVar14 = (ImGuiTable *)0x0;
  }
  else {
    pIVar14 = (pIVar10->Tables).Buf.Data +
              (pIVar10->CurrentTableStack).Data[(long)iVar13 + -2].Index;
  }
  pIVar10->CurrentTable = pIVar14;
  if (pIVar14 == (ImGuiTable *)0x0) {
    iVar13 = -1;
  }
  else {
    iVar13 = (int)((ulong)((long)pIVar14 - (long)(pIVar10->Tables).Buf.Data) >> 3) * -0x69d0369d;
  }
  (pIVar7->DC).CurrentTableIdx = iVar13;
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    inner_window->DC.PrevLineSize = table->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = table->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = table->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    table->DrawSplitter.Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize))
                table->ColumnsAutoFitWidth += column->WidthRequest;
            else
                table->ColumnsAutoFitWidth += TableGetColumnWidthAuto(table, column);
        }

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= table->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = table->HostBackupWorkRect;
    inner_window->ParentWorkRect = table->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = table->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = table->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = table->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (table->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - table->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (table->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - table->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    g.CurrentTableStack.pop_back();
    g.CurrentTable = g.CurrentTableStack.Size ? g.Tables.GetByIndex(g.CurrentTableStack.back().Index) : NULL;
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}